

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O3

int Jf(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined8 *puVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = *(double *)((long)user_data + 0x10);
  pdVar3 = *(double **)((long)y->content + 0x10);
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  puVar4 = *(undefined8 **)((long)J->content + 0x20);
  *(undefined8 *)*puVar4 = 0;
  *(undefined8 *)puVar4[1] = 0;
  dVar5 = cos(t);
  *(double *)(**(long **)((long)J->content + 0x20) + 8) =
       ((dVar5 * 0.5 + 1.0) * dVar6) / ((dVar1 + dVar1) * dVar1) + dVar6 * 0.5;
  dVar6 = cos(t * *(double *)((long)user_data + 8));
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) =
       -0.5 - (dVar6 + 2.0) / ((dVar2 + dVar2) * dVar2);
  return 0;
}

Assistant:

static int Jf(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);

  /* fill in the Jacobian:
     [        0                           0        ]
     [e/2+e*(1+r(t))/(2*u^2)  -1/2-(2+s(t))/(2*v^2)] */
  SM_ELEMENT_D(J, 0, 0) = ZERO;
  SM_ELEMENT_D(J, 0, 1) = ZERO;
  SM_ELEMENT_D(J, 1, 0) = e / TWO + e * (ONE + r(t, rpar)) / (TWO * u * u);
  SM_ELEMENT_D(J, 1, 1) = -ONE / TWO - (TWO + s(t, rpar)) / (TWO * v * v);

  /* Return with success */
  return 0;
}